

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strex.cc
# Opt level: O0

int do_dump(unsigned_long flags,BIO *out,ASN1_STRING *str)

{
  int iVar1;
  int outlen;
  int der_len;
  uchar *der_buf;
  ASN1_TYPE t;
  int outlen_1;
  ASN1_STRING *str_local;
  BIO *out_local;
  unsigned_long flags_local;
  
  iVar1 = maybe_write(out,"#",1);
  if (iVar1 == 0) {
    flags_local._4_4_ = -1;
  }
  else if ((flags & 0x200) == 0) {
    iVar1 = do_hex_dump(out,str->data,str->length);
    if (iVar1 < 0) {
      flags_local._4_4_ = -1;
    }
    else {
      flags_local._4_4_ = iVar1 + 1;
    }
  }
  else {
    OPENSSL_memset(&der_buf,0,0x10);
    asn1_type_set0_string((ASN1_TYPE *)&der_buf,str);
    _outlen = (uchar *)0x0;
    iVar1 = i2d_ASN1_TYPE((ASN1_TYPE *)&der_buf,(uchar **)&outlen);
    if (iVar1 < 0) {
      flags_local._4_4_ = -1;
    }
    else {
      iVar1 = do_hex_dump(out,_outlen,iVar1);
      OPENSSL_free(_outlen);
      if (iVar1 < 0) {
        flags_local._4_4_ = -1;
      }
      else {
        flags_local._4_4_ = iVar1 + 1;
      }
    }
  }
  return flags_local._4_4_;
}

Assistant:

static int do_dump(unsigned long flags, BIO *out, const ASN1_STRING *str) {
  if (!maybe_write(out, "#", 1)) {
    return -1;
  }

  // If we don't dump DER encoding just dump content octets
  if (!(flags & ASN1_STRFLGS_DUMP_DER)) {
    int outlen = do_hex_dump(out, str->data, str->length);
    if (outlen < 0) {
      return -1;
    }
    return outlen + 1;
  }

  // Placing the ASN1_STRING in a temporary ASN1_TYPE allows the DER encoding
  // to readily obtained.
  ASN1_TYPE t;
  OPENSSL_memset(&t, 0, sizeof(ASN1_TYPE));
  asn1_type_set0_string(&t, (ASN1_STRING *)str);
  unsigned char *der_buf = NULL;
  int der_len = i2d_ASN1_TYPE(&t, &der_buf);
  if (der_len < 0) {
    return -1;
  }
  int outlen = do_hex_dump(out, der_buf, der_len);
  OPENSSL_free(der_buf);
  if (outlen < 0) {
    return -1;
  }
  return outlen + 1;
}